

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

void BinarySink_put_mp_ssh1(BinarySink *bs,mp_int *x)

{
  size_t val;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  val = mp_get_nbits(x);
  if (val < 0x10000) {
    BinarySink_put_uint16(bs->binarysink_,val);
    if (val != 0) {
      uVar2 = val + 7 >> 3;
      uVar3 = val + 7 & 0xfffffffffffffff8;
      do {
        uVar2 = uVar2 - 1;
        uVar3 = uVar3 - 8;
        if (uVar2 >> 3 < x->nw) {
          uVar1 = x->w[uVar2 >> 3];
        }
        else {
          uVar1 = 0;
        }
        BinarySink_put_byte(bs->binarysink_,(uchar)(uVar1 >> ((byte)uVar3 & 0x38)));
      } while (uVar2 != 0);
    }
    return;
  }
  __assert_fail("bits < 0x10000",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0x25a,"void BinarySink_put_mp_ssh1(BinarySink *, mp_int *)");
}

Assistant:

void BinarySink_put_mp_ssh1(BinarySink *bs, mp_int *x)
{
    size_t bits = mp_get_nbits(x);
    size_t bytes = (bits + 7) / 8;

    assert(bits < 0x10000);
    put_uint16(bs, bits);
    for (size_t i = bytes; i-- > 0 ;)
        put_byte(bs, mp_get_byte(x, i));
}